

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringRef.cpp
# Opt level: O2

size_t __thiscall llvm::StringRef::rfind(StringRef *this,StringRef Str)

{
  ulong uVar1;
  char *pcVar2;
  int iVar3;
  ulong __n;
  size_t sVar4;
  ulong uVar5;
  ulong uVar6;
  
  __n = Str.Length;
  uVar1 = this->Length;
  uVar6 = uVar1 - __n;
  if (__n <= uVar1) {
    sVar4 = uVar6 + 1;
    pcVar2 = this->Data;
    for (; uVar6 != 0xffffffffffffffff; uVar6 = uVar6 - 1) {
      sVar4 = sVar4 - 1;
      uVar5 = uVar6;
      if (uVar1 < uVar6) {
        uVar5 = uVar1;
      }
      if (__n <= uVar1 - uVar5) {
        if (__n == 0) {
          return sVar4;
        }
        iVar3 = bcmp(pcVar2 + uVar5,Str.Data,__n);
        if (iVar3 == 0) {
          return uVar6;
        }
      }
    }
  }
  return 0xffffffffffffffff;
}

Assistant:

size_t StringRef::rfind(StringRef Str) const {
  size_t N = Str.size();
  if (N > Length)
    return npos;
  for (size_t i = Length - N + 1, e = 0; i != e;) {
    --i;
    if (substr(i, N).equals(Str))
      return i;
  }
  return npos;
}